

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

void __thiscall sptk::Matrix::~Matrix(Matrix *this)

{
  pointer ppdVar1;
  pointer pdVar2;
  
  this->_vptr_Matrix = (_func_int **)&PTR__Matrix_0010fd28;
  ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppdVar1 != (pointer)0x0) {
    operator_delete(ppdVar1);
  }
  pdVar2 = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
    return;
  }
  return;
}

Assistant:

virtual ~Matrix() {
  }